

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void array_get_bang(t_array_rangeop *x)

{
  _outlet *x_00;
  int iVar1;
  t_atom *argv;
  undefined4 *puVar2;
  t_atom *ptVar3;
  long lVar4;
  long lVar5;
  undefined1 auStack_38 [12];
  int arrayonset;
  char *firstitem;
  int stride;
  int nitem;
  
  ptVar3 = (t_atom *)auStack_38;
  iVar1 = array_rangeop_getrange
                    (x,(char **)(auStack_38 + 8),(int *)((long)&firstitem + 4),(int *)&firstitem,
                     (int *)(auStack_38 + 4));
  if (iVar1 != 0) {
    lVar5 = (long)firstitem._4_4_;
    if (lVar5 < 100) {
      ptVar3 = (t_atom *)(auStack_38 + lVar5 * -0x10);
      argv = ptVar3;
    }
    else {
      argv = (t_atom *)getbytes(lVar5 << 4);
    }
    if (0 < firstitem._4_4_) {
      lVar4 = 0;
      puVar2 = stack0xffffffffffffffd0;
      do {
        *(undefined4 *)((long)&argv->a_type + lVar4) = 1;
        *(undefined4 *)((long)&argv->a_w + lVar4) = *puVar2;
        puVar2 = (undefined4 *)((long)puVar2 + (long)(int)firstitem);
        lVar4 = lVar4 + 0x10;
      } while (lVar5 << 4 != lVar4);
    }
    x_00 = (x->x_tc).tc_obj.te_outlet;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17c069;
    outlet_list(x_00,(t_symbol *)0x0,firstitem._4_4_,argv);
    if (99 < firstitem._4_4_) {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17c07e;
      freebytes(argv,lVar5 << 4);
    }
  }
  return;
}

Assistant:

static void array_get_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    t_atom *outv;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    ATOMS_ALLOCA(outv, nitem);
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        SETFLOAT(&outv[i],  *(t_float *)itemp);
    outlet_list(x->x_outlet, 0, nitem, outv);
    ATOMS_FREEA(outv, nitem);
}